

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O0

void Curl_pgrsTime(Curl_easy *data,timerid timer)

{
  undefined8 uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [12];
  time_t tVar6;
  timediff_t tVar7;
  int iVar8;
  curltime cVar9;
  curltime newer;
  curltime older;
  curltime older_00;
  long local_38;
  timediff_t us;
  time_t *delta;
  curltime now;
  timerid timer_local;
  Curl_easy *data_local;
  
  cVar9 = Curl_now();
  tVar6 = cVar9.tv_sec;
  iVar8 = cVar9.tv_usec;
  us = 0;
  auVar5 = cVar9._0_12_;
  switch(timer) {
  default:
    break;
  case TIMER_STARTOP:
    (data->progress).t_startop.tv_sec = tVar6;
    *(ulong *)&(data->progress).t_startop.tv_usec = CONCAT44(now.tv_sec._4_4_,iVar8);
    break;
  case TIMER_STARTSINGLE:
    (data->progress).t_startsingle.tv_sec = tVar6;
    *(ulong *)&(data->progress).t_startsingle.tv_usec = CONCAT44(now.tv_sec._4_4_,iVar8);
    (data->progress).is_t_startransfer_set = false;
    break;
  case TIMER_NAMELOOKUP:
    us = (timediff_t)&(data->progress).t_nslookup;
    break;
  case TIMER_CONNECT:
    us = (timediff_t)&(data->progress).t_connect;
    break;
  case TIMER_APPCONNECT:
    us = (timediff_t)&(data->progress).t_appconnect;
    break;
  case TIMER_PRETRANSFER:
    us = (timediff_t)&(data->progress).t_pretransfer;
    break;
  case TIMER_STARTTRANSFER:
    us = (timediff_t)&(data->progress).t_starttransfer;
    if (((data->progress).is_t_startransfer_set & 1U) != 0) {
      return;
    }
    (data->progress).is_t_startransfer_set = true;
    break;
  case TIMER_POSTRANSFER:
    break;
  case TIMER_STARTACCEPT:
    (data->progress).t_acceptdata.tv_sec = tVar6;
    *(ulong *)&(data->progress).t_acceptdata.tv_usec = CONCAT44(now.tv_sec._4_4_,iVar8);
    break;
  case TIMER_REDIRECT:
    uVar1 = (data->progress).start.tv_sec;
    uVar2 = (data->progress).start.tv_usec;
    older.tv_usec = uVar2;
    older.tv_sec = uVar1;
    cVar9._12_4_ = 0;
    cVar9.tv_sec = auVar5._0_8_;
    cVar9.tv_usec = auVar5._8_4_;
    older._12_4_ = 0;
    tVar7 = Curl_timediff_us(cVar9,older);
    (data->progress).t_redirect = tVar7;
  }
  if (us != 0) {
    uVar3 = (data->progress).t_startsingle.tv_sec;
    uVar4 = (data->progress).t_startsingle.tv_usec;
    older_00.tv_usec = uVar4;
    older_00.tv_sec = uVar3;
    newer._12_4_ = 0;
    newer.tv_sec = auVar5._0_8_;
    newer.tv_usec = auVar5._8_4_;
    older_00._12_4_ = 0;
    local_38 = Curl_timediff_us(newer,older_00);
    if (local_38 < 1) {
      local_38 = 1;
    }
    *(long *)us = local_38 + *(long *)us;
  }
  return;
}

Assistant:

void Curl_pgrsTime(struct Curl_easy *data, timerid timer)
{
  struct curltime now = Curl_now();
  time_t *delta = NULL;

  switch(timer) {
  default:
  case TIMER_NONE:
    /* mistake filter */
    break;
  case TIMER_STARTOP:
    /* This is set at the start of a transfer */
    data->progress.t_startop = now;
    break;
  case TIMER_STARTSINGLE:
    /* This is set at the start of each single fetch */
    data->progress.t_startsingle = now;
    data->progress.is_t_startransfer_set = false;
    break;
  case TIMER_STARTACCEPT:
    data->progress.t_acceptdata = now;
    break;
  case TIMER_NAMELOOKUP:
    delta = &data->progress.t_nslookup;
    break;
  case TIMER_CONNECT:
    delta = &data->progress.t_connect;
    break;
  case TIMER_APPCONNECT:
    delta = &data->progress.t_appconnect;
    break;
  case TIMER_PRETRANSFER:
    delta = &data->progress.t_pretransfer;
    break;
  case TIMER_STARTTRANSFER:
    delta = &data->progress.t_starttransfer;
    /* prevent updating t_starttransfer unless:
     *   1) this is the first time we're setting t_starttransfer
     *   2) a redirect has occurred since the last time t_starttransfer was set
     * This prevents repeated invocations of the function from incorrectly
     * changing the t_starttransfer time.
     */
    if(data->progress.is_t_startransfer_set) {
      return;
    }
    else {
      data->progress.is_t_startransfer_set = true;
      break;
    }
  case TIMER_POSTRANSFER:
    /* this is the normal end-of-transfer thing */
    break;
  case TIMER_REDIRECT:
    data->progress.t_redirect = Curl_timediff_us(now, data->progress.start);
    break;
  }
  if(delta) {
    timediff_t us = Curl_timediff_us(now, data->progress.t_startsingle);
    if(us < 1)
      us = 1; /* make sure at least one microsecond passed */
    *delta += us;
  }
}